

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O3

int netaddr_from_string(netaddr *dst,char *src)

{
  undefined2 uVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  ushort **src_00;
  ushort **ppuVar8;
  char cVar9;
  ushort *puVar10;
  byte bVar11;
  size_t bin_size;
  int iVar12;
  ushort **ppuVar13;
  ushort **__nptr;
  long lVar14;
  bool bVar15;
  char *ptr3;
  netaddr_str buf;
  char *local_78;
  char local_6e [62];
  
  dst->_addr[0] = '\0';
  dst->_addr[1] = '\0';
  dst->_addr[2] = '\0';
  dst->_addr[3] = '\0';
  dst->_addr[4] = '\0';
  dst->_addr[5] = '\0';
  dst->_addr[6] = '\0';
  dst->_addr[7] = '\0';
  dst->_addr[8] = '\0';
  dst->_addr[9] = '\0';
  dst->_addr[10] = '\0';
  dst->_addr[0xb] = '\0';
  dst->_addr[0xc] = '\0';
  dst->_addr[0xd] = '\0';
  dst->_addr[0xe] = '\0';
  dst->_addr[0xf] = '\0';
  dst->_type = '\0';
  dst->_prefix_len = '\0';
  if ((*src == '-') && (src[1] == '\0')) {
    return 0;
  }
  lVar14 = 8;
  do {
    iVar6 = strcasecmp(src,*(char **)(&UNK_00172c98 + lVar14));
    if (iVar6 == 0) {
      puVar2 = *(undefined8 **)((long)&_known_prefixes[0].name + lVar14);
      uVar1 = *(undefined2 *)(puVar2 + 2);
      dst->_type = (char)uVar1;
      dst->_prefix_len = (char)((ushort)uVar1 >> 8);
      uVar3 = puVar2[1];
      *(undefined8 *)dst->_addr = *puVar2;
      *(undefined8 *)(dst->_addr + 8) = uVar3;
      return 0;
    }
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0x58);
  strscpy(local_6e,src,0x3e);
  src_00 = (ushort **)str_trim(local_6e);
  cVar9 = *(char *)src_00;
  if (cVar9 != '\0') {
    ppuVar8 = __ctype_b_loc();
    puVar10 = *ppuVar8;
    bVar15 = false;
    bVar5 = false;
    bVar4 = false;
    iVar6 = 0;
    iVar12 = 0;
    ppuVar13 = src_00;
LAB_00141df6:
    if ((cVar9 != '/') && ((puVar10[cVar9] & 0x2000) == 0)) goto code_r0x00141e18;
    if ((puVar10[cVar9] >> 0xd & 1) != 0) {
      do {
        *(char *)ppuVar13 = '\0';
        cVar9 = *(char *)((long)ppuVar13 + 1);
        ppuVar13 = (ushort **)((long)ppuVar13 + 1);
        puVar10 = *ppuVar8;
      } while ((*(byte *)((long)puVar10 + (long)cVar9 * 2 + 1) & 0x20) != 0);
    }
    if (cVar9 == '/') {
      *(char *)ppuVar13 = '\0';
      cVar9 = *(char *)((long)ppuVar13 + 1);
      ppuVar13 = (ushort **)((long)ppuVar13 + 1);
      puVar10 = *ppuVar8;
    }
    bVar11 = *(byte *)((long)puVar10 + (long)cVar9 * 2 + 1);
    __nptr = ppuVar13;
    while ((bVar11 & 0x20) != 0) {
      *(char *)__nptr = '\0';
      cVar9 = *(char *)((long)__nptr + 1);
      __nptr = (ushort **)((long)__nptr + 1);
      bVar11 = *(byte *)((long)*ppuVar8 + (long)cVar9 * 2 + 1);
    }
    if (cVar9 == '\0') goto LAB_00142058;
    ppuVar8 = (ushort **)strtoul((char *)__nptr,&local_78,10);
    if (local_78 != (char *)0x0) {
      ppuVar8 = (ushort **)(ulong)(-(uint)(*local_78 != '\0') | (uint)ppuVar8);
    }
    uVar7 = (uint)ppuVar8;
    goto LAB_00141f1b;
  }
  iVar12 = 0;
  iVar6 = 0;
  bVar4 = false;
  bVar5 = false;
  ppuVar8 = src_00;
  __nptr = src_00;
LAB_00141e82:
  uVar7 = 0xffffffff;
LAB_00141f1b:
  if (iVar6 == 5 || iVar12 == 5) {
    if (iVar6 != 0 && iVar12 != 0) goto LAB_00142058;
    if (!bVar5) {
      if (bVar4) {
        bVar5 = false;
        goto LAB_00141f60;
      }
      dst->_type = '/';
      dst->_prefix_len = '0';
      bin_size = 6;
      if (iVar12 == 0) goto LAB_00141fdf;
      cVar9 = ':';
      goto LAB_00141fec;
    }
    bVar5 = true;
LAB_00141f79:
    if (!(bool)(iVar12 == 0 & bVar5 & iVar6 == 0)) {
      bVar11 = (iVar12 == 7 | bVar4) & iVar6 == 0;
      if (bVar11 == 1) {
        dst->_type = '\n';
        dst->_prefix_len = 0x80;
        iVar6 = inet_pton(10,(char *)src_00,dst);
        iVar6 = -(uint)(iVar6 != 1);
      }
      else {
        if ((iVar6 != 4 || bVar5) || (iVar12 == 0) != true) goto LAB_00142058;
        dst->_type = '1';
        dst->_prefix_len = 0x80;
        iVar6 = _uuid_from_string(dst,(size_t)src_00,
                                  (char *)(CONCAT71((int7)((ulong)ppuVar8 >> 8),bVar11) & 0xffffffff
                                          ));
      }
      goto LAB_00142054;
    }
    dst->_type = '\x02';
    dst->_prefix_len = ' ';
    iVar6 = inet_pton(2,(char *)src_00,dst);
    if (iVar6 != 1) goto LAB_00142058;
    cVar9 = *(char *)__nptr;
    if ((cVar9 != '\0') && (uVar7 == 0xffffffff)) {
      uVar7 = _subnetmask_to_prefixlen((char *)__nptr);
      goto LAB_00142070;
    }
  }
  else {
LAB_00141f60:
    if ((iVar12 != 0 || bVar5) || iVar6 != 7) goto LAB_00141f79;
    dst->_type = '0';
    dst->_prefix_len = '@';
    dst->_addr[7] = '\x02';
    bin_size = 8;
LAB_00141fdf:
    cVar9 = '-';
LAB_00141fec:
    iVar6 = _bin_from_hex(dst,bin_size,(char *)src_00,cVar9);
LAB_00142054:
    if (iVar6 != 0) goto LAB_00142058;
LAB_00142070:
    cVar9 = *(char *)__nptr;
  }
  if (cVar9 == '\0') {
    return 0;
  }
  if ((-1 < (int)uVar7) && (uVar7 <= dst->_prefix_len)) {
    dst->_prefix_len = (uint8_t)uVar7;
    return 0;
  }
LAB_00142058:
  dst->_type = '\0';
  return -1;
code_r0x00141e18:
  if (cVar9 == '-') {
    iVar6 = iVar6 + 1;
  }
  else if (cVar9 == '.') {
    bVar5 = true;
  }
  else if (cVar9 == ':') {
    if (bVar15) {
      bVar4 = true;
    }
    iVar12 = iVar12 + 1;
  }
  __nptr = (ushort **)((long)ppuVar13 + 1);
  bVar15 = cVar9 == ':';
  cVar9 = *(char *)((long)ppuVar13 + 1);
  ppuVar13 = __nptr;
  if (cVar9 == '\0') goto LAB_00141e82;
  goto LAB_00141df6;
}

Assistant:

int
netaddr_from_string(struct netaddr *dst, const char *src) {
  struct netaddr_str buf;
  unsigned int colon_count, minus_count;
  int result;
  int prefix_len;
  bool has_coloncolon, has_point;
  bool last_was_colon;
  char *ptr1, *ptr2, *ptr3;
  size_t i;

  memset(dst, 0, sizeof(*dst));

  if (strcmp(src, "-") == 0) {
    /* unspec */
    netaddr_invalidate(dst);
    return 0;
  }

  /* handle string representations of prefixes */
  for (i = 0; i < ARRAYSIZE(_known_prefixes); i++) {
    if (strcasecmp(src, _known_prefixes[i].name) == 0) {
      memcpy(dst, _known_prefixes[i].prefix, sizeof(*dst));
      return 0;
    }
  }

  colon_count = 0;
  minus_count = 0;
  has_coloncolon = false;
  has_point = false;

  last_was_colon = false;

  result = -1;
  prefix_len = -1;

  /* copy input string in temporary buffer */
  strscpy(buf.buf, src, sizeof(buf));
  ptr1 = buf.buf;

  ptr1 = str_trim(ptr1);

  ptr2 = ptr1;
  while (*ptr2 != 0 && !isspace(*ptr2) && *ptr2 != '/') {
    switch (*ptr2) {
      case ':':
        if (last_was_colon) {
          has_coloncolon = true;
        }
        colon_count++;
        break;

      case '.':
        has_point = true;
        break;

      case '-':
        minus_count++;
        break;

      default:
        break;
    }
    last_was_colon = *ptr2++ == ':';
  }

  if (*ptr2) {
    /* split strings */
    while (isspace(*ptr2))
      *ptr2++ = 0;
    if (*ptr2 == '/') {
      *ptr2++ = 0;
    }
    while (isspace(*ptr2))
      *ptr2++ = 0;

    if (*ptr2 == 0) {
      /* prefixlength is missing */
      dst->_type = AF_UNSPEC;
      return -1;
    }

    /* try to read numeric prefix length */
    prefix_len = (int)strtoul(ptr2, &ptr3, 10);
    if (ptr3 && *ptr3) {
      /* not a numeric prefix length */
      prefix_len = -1;
    }
  }

  /* use dst->prefix_len as storage for maximum prefixlen */
  if ((colon_count == 5 || minus_count == 5) && (colon_count == 0 || minus_count == 0) && !has_point &&
      !has_coloncolon) {
    dst->_type = AF_MAC48;
    dst->_prefix_len = 48;
    if (colon_count > 0) {
      result = _bin_from_hex(dst->_addr, 6, ptr1, ':');
    }
    else {
      result = _bin_from_hex(dst->_addr, 6, ptr1, '-');
    }
  }
  else if (colon_count == 0 && !has_point && minus_count == 7) {
    dst->_type = AF_EUI64;
    dst->_prefix_len = 64;
    dst->_addr[7] = 2;
    result = _bin_from_hex(dst->_addr, 8, ptr1, '-');
  }
  else if (colon_count == 0 && has_point && minus_count == 0) {
    dst->_type = AF_INET;
    dst->_prefix_len = 32;
    result = inet_pton(AF_INET, ptr1, dst->_addr) == 1 ? 0 : -1;

    if (result == 0 && *ptr2 && prefix_len == -1) {
      /* we need a prefix length, but its not a numerical one */
      prefix_len = _subnetmask_to_prefixlen(ptr2);
    }
  }
  else if ((has_coloncolon || colon_count == 7) && minus_count == 0) {
    dst->_type = AF_INET6;
    dst->_prefix_len = 128;
    result = inet_pton(AF_INET6, ptr1, dst->_addr) == 1 ? 0 : -1;
  }
  else if (minus_count == 4 && colon_count == 0 && !has_point) {
    dst->_type = AF_UUID;
    dst->_prefix_len = 128;
    result = _uuid_from_string(dst->_addr, sizeof(dst->_addr), ptr1);
  }

  /* stop if an error happened */
  if (result) {
    dst->_type = AF_UNSPEC;
    return -1;
  }

  if (*ptr2) {
    if (prefix_len < 0 || prefix_len > dst->_prefix_len) {
      /* prefix is too long */
      dst->_type = AF_UNSPEC;
      return -1;
    }

    /* store real prefix length */
    dst->_prefix_len = (uint8_t)prefix_len;
  }
  return 0;
}